

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O2

bool hasDuplicates<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys)

{
  pointer pbVar1;
  __type _Var2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar5;
  long local_38;
  
  lVar3 = (long)(keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_38 = lVar3 + -0x40;
  lVar3 = lVar3 >> 5;
  while (lVar3 != 0) {
    lVar5 = 0;
    lVar4 = local_38;
    while (lVar5 = lVar5 + 1, lVar3 != lVar5) {
      pbVar1 = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar1->_M_dataplus)._M_p + lVar4);
      lVar4 = lVar4 + -0x20;
      _Var2 = std::operator==(pbVar1 + lVar3 + -1,__rhs);
      if (_Var2) goto LAB_001068d6;
    }
    local_38 = local_38 + -0x20;
    lVar3 = lVar3 + -1;
  }
LAB_001068d6:
  return lVar3 != 0;
}

Assistant:

static bool hasDuplicates(const std::vector<KeyType>& keys){
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        for(size_t j = i-1; j < std::numeric_limits<size_t>::max(); j--)
            if(keys[i] == keys[j]) return true;

    return false;
}